

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

void uv__udp_io(uv_loop_t *loop,uv__io_t *w,uint revents)

{
  uint *handle;
  int iVar1;
  long lVar2;
  ssize_t sVar3;
  int *piVar4;
  int iVar5;
  ssize_t sVar6;
  bool bVar7;
  msghdr h;
  sockaddr_storage peer;
  uv_buf_t local_f8;
  msghdr local_e8;
  undefined1 local_b0 [128];
  
  if (*(int *)&w[-2].cb != 0xf) {
    __assert_fail("handle->type == UV_UDP",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                  ,0x8b,"void uv__udp_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  handle = &w[-3].pevents;
  if ((revents & 1) != 0) {
    if (*(long *)&w[-1].fd == 0) {
      __assert_fail("handle->recv_cb != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                    ,0x9f,"void uv__udp_recvmsg(uv_udp_t *)");
    }
    lVar2._0_4_ = w[-1].pevents;
    lVar2._4_4_ = w[-1].events;
    if (lVar2 == 0) {
      __assert_fail("handle->alloc_cb != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                    ,0xa0,"void uv__udp_recvmsg(uv_udp_t *)");
    }
    local_e8.msg_namelen = 0;
    local_e8._12_4_ = 0;
    local_e8.msg_control = (void *)0x0;
    local_e8.msg_controllen = 0;
    local_e8.msg_iov = (iovec *)0x0;
    local_e8.msg_iovlen = 0;
    local_e8.msg_flags = 0;
    local_e8._52_4_ = 0;
    local_e8.msg_name = local_b0;
    iVar5 = 0x20;
    while( true ) {
      local_f8 = uv_buf_init((char *)0x0,0);
      (**(code **)&w[-1].pevents)(handle,0x10000,&local_f8);
      if ((local_f8.base == (char *)0x0) || (local_f8.len == 0)) break;
      local_e8.msg_namelen = 0x80;
      local_e8.msg_iovlen = 1;
      local_e8.msg_iov = (iovec *)&local_f8;
      do {
        sVar3 = recvmsg(w->fd,&local_e8,0);
        sVar6 = sVar3;
        if (sVar3 != -1) goto LAB_00548043;
        piVar4 = __errno_location();
        iVar1 = *piVar4;
      } while ((long)iVar1 == 4);
      if (iVar1 == 0xb) {
        sVar6 = 0;
      }
      else {
        sVar6 = -(long)iVar1;
      }
LAB_00548043:
      (**(code **)&w[-1].fd)(handle,sVar6,&local_f8);
      if ((((sVar3 == -1) || (bVar7 = iVar5 == 0, iVar5 = iVar5 + -1, bVar7)) || (w->fd == -1)) ||
         (*(long *)&w[-1].fd == 0)) goto LAB_00548082;
    }
    (**(code **)&w[-1].fd)(handle,0xffffffffffffff97,&local_f8,0,0);
  }
LAB_00548082:
  if ((revents & 4) != 0) {
    uv__udp_sendmsg((uv_udp_t *)handle);
    uv__udp_run_completed((uv_udp_t *)handle);
  }
  return;
}

Assistant:

static void uv__udp_io(uv_loop_t* loop, uv__io_t* w, unsigned int revents) {
  uv_udp_t* handle;

  handle = container_of(w, uv_udp_t, io_watcher);
  assert(handle->type == UV_UDP);

  if (revents & POLLIN)
    uv__udp_recvmsg(handle);

  if (revents & POLLOUT) {
    uv__udp_sendmsg(handle);
    uv__udp_run_completed(handle);
  }
}